

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

void xmlTextReaderFreeProp(xmlTextReaderPtr reader,xmlAttrPtr cur)

{
  int iVar1;
  xmlDeregisterNodeFunc *pp_Var2;
  xmlDictPtr local_20;
  xmlDictPtr dict;
  xmlAttrPtr cur_local;
  xmlTextReaderPtr reader_local;
  
  if ((reader == (xmlTextReaderPtr)0x0) || (reader->ctxt == (xmlParserCtxtPtr)0x0)) {
    local_20 = (xmlDictPtr)0x0;
  }
  else {
    local_20 = reader->ctxt->dict;
  }
  if (cur != (xmlAttrPtr)0x0) {
    if ((xmlRegisterCallbacks != 0) &&
       (pp_Var2 = __xmlDeregisterNodeDefaultValue(), *pp_Var2 != (xmlDeregisterNodeFunc)0x0)) {
      pp_Var2 = __xmlDeregisterNodeDefaultValue();
      (**pp_Var2)((xmlNodePtr)cur);
    }
    if (cur->children != (_xmlNode *)0x0) {
      xmlTextReaderFreeNodeList(reader,cur->children);
    }
    if (cur->id == (_xmlID *)0x0) {
      if ((cur->name != (xmlChar *)0x0) &&
         ((local_20 == (xmlDictPtr)0x0 || (iVar1 = xmlDictOwns(local_20,cur->name), iVar1 == 0)))) {
        (*xmlFree)(cur->name);
      }
    }
    else {
      cur->id->attr = (xmlAttrPtr)0x0;
      if (((cur->id->name != (xmlChar *)0x0) && (cur->id->name != (xmlChar *)0x0)) &&
         ((local_20 == (xmlDictPtr)0x0 || (iVar1 = xmlDictOwns(local_20,cur->id->name), iVar1 == 0))
         )) {
        (*xmlFree)(cur->id->name);
      }
      cur->id->name = cur->name;
      cur->name = (xmlChar *)0x0;
    }
    if (((reader == (xmlTextReaderPtr)0x0) || (reader->ctxt == (xmlParserCtxtPtr)0x0)) ||
       (99 < reader->ctxt->freeAttrsNr)) {
      (*xmlFree)(cur);
    }
    else {
      cur->next = reader->ctxt->freeAttrs;
      reader->ctxt->freeAttrs = cur;
      reader->ctxt->freeAttrsNr = reader->ctxt->freeAttrsNr + 1;
    }
  }
  return;
}

Assistant:

static void
xmlTextReaderFreeProp(xmlTextReaderPtr reader, xmlAttrPtr cur) {
    xmlDictPtr dict;

    if ((reader != NULL) && (reader->ctxt != NULL))
	dict = reader->ctxt->dict;
    else
        dict = NULL;
    if (cur == NULL) return;

    if ((xmlRegisterCallbacks) && (xmlDeregisterNodeDefaultValue))
	xmlDeregisterNodeDefaultValue((xmlNodePtr) cur);

    if (cur->children != NULL)
        xmlTextReaderFreeNodeList(reader, cur->children);

    if (cur->id != NULL) {
        /*
         * Operating in streaming mode, attr is gonna disappear
         */
        cur->id->attr = NULL;
        if (cur->id->name != NULL)
            DICT_FREE(cur->id->name);
        cur->id->name = cur->name;
        cur->name = NULL;
    } else {
        DICT_FREE(cur->name);
    }

    if ((reader != NULL) && (reader->ctxt != NULL) &&
        (reader->ctxt->freeAttrsNr < MAX_FREE_NODES)) {
        cur->next = reader->ctxt->freeAttrs;
	reader->ctxt->freeAttrs = cur;
	reader->ctxt->freeAttrsNr++;
    } else {
	xmlFree(cur);
    }
}